

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

ScalarFunction * duckdb::ListAggregateFun::GetFunction(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ScalarFunction *in_RDI;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_181;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  LogicalType local_160 [24];
  LogicalType local_148 [24];
  LogicalType local_130 [8];
  undefined8 local_128;
  undefined8 uStack_120;
  LogicalType local_118 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_100;
  LogicalType local_e8 [24];
  BaseScalarFunction local_d0 [176];
  
  duckdb::LogicalType::LogicalType(local_160,ANY);
  duckdb::LogicalType::LIST(local_130);
  duckdb::LogicalType::LogicalType(local_118,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_130;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_100,__l,&local_181);
  duckdb::LogicalType::LogicalType(local_148,ANY);
  local_178 = 0;
  local_180 = ListAggregateFunction;
  local_168 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_170 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_e8,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_e8);
  if (local_170 != (code *)0x0) {
    (*local_170)(&local_180,&local_180,3);
  }
  duckdb::LogicalType::~LogicalType(local_148);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_100);
  lVar3 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_130 + lVar3);
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  duckdb::LogicalType::~LogicalType(local_160);
  BaseScalarFunction::SetReturnsError(local_d0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  in_RDI->field_0xa9 = 1;
  duckdb::LogicalType::LogicalType(local_130,ANY);
  in_RDI->field_0x78 = local_130[0];
  in_RDI->field_0x79 = local_130[1];
  uVar1 = *(undefined8 *)&in_RDI->field_0x80;
  uVar2 = *(undefined8 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = local_128;
  *(undefined8 *)&in_RDI->field_0x88 = uStack_120;
  local_128 = uVar1;
  uStack_120 = uVar2;
  duckdb::LogicalType::~LogicalType(local_130);
  in_RDI->serialize = ListAggregatesBindData::SerializeFunction;
  in_RDI->deserialize = ListAggregatesBindData::DeserializeFunction;
  return in_RDI;
}

Assistant:

ScalarFunction ListAggregateFun::GetFunction() {
	auto result =
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR}, LogicalType::ANY,
	                   ListAggregateFunction, ListAggregateBind, nullptr, nullptr, ListAggregatesInitLocalState);
	BaseScalarFunction::SetReturnsError(result);
	result.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	result.varargs = LogicalType::ANY;
	result.serialize = ListAggregatesBindData::SerializeFunction;
	result.deserialize = ListAggregatesBindData::DeserializeFunction;
	return result;
}